

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

void writedata(void)

{
  int iVar1;
  symboltype sVar2;
  int iVar3;
  datatype dVar4;
  char *__format;
  float fVar5;
  char label [10];
  char local_32 [10];
  
  fwrite("_DATA SEGMENT word public \'data\'\n",0x21,1,(FILE *)ofp);
  fwrite("TestResult     dw     ?\n",0x18,1,(FILE *)ofp);
  iVar1 = tablesize();
  if (0x24 < iVar1) {
    iVar1 = 0x24;
    do {
      sVar2 = symclass(iVar1);
      if (sVar2 == sttempvar) {
LAB_00108ded:
        iVar3 = getproc(iVar1);
        if (iVar3 != 0x23) goto LAB_00108e1b;
        getlabel(iVar1,local_32);
        dVar4 = data_class(iVar1);
        if (dVar4 == dtinteger) {
          __format = "%-10s     dw     ?\n";
        }
        else {
          __format = "%-10s     dd     ?\n";
        }
        fprintf((FILE *)ofp,__format,local_32);
      }
      else {
        sVar2 = symclass(iVar1);
        if (sVar2 == stvariable) goto LAB_00108ded;
LAB_00108e1b:
        sVar2 = symclass(iVar1);
        if (sVar2 == stliteral) {
          dVar4 = data_class(iVar1);
          if (dVar4 == dtreal) {
            getlabel(iVar1,local_32);
            fVar5 = getrvalue(iVar1);
            fprintf((FILE *)ofp,"%-10s     dd     %f\n",(double)fVar5,local_32);
          }
        }
      }
      iVar1 = iVar1 + 1;
      iVar3 = tablesize();
    } while (iVar1 < iVar3);
  }
  fwrite("_DATA ENDS\n\n",0xc,1,(FILE *)ofp);
  return;
}

Assistant:

void    writedata(void)
{    
    fprintf(ofp, "_DATA SEGMENT word public \'data\'\n");
    fprintf(ofp, "TestResult     dw     ?\n");
    
    int    i;
    float    litvalue;
    char    label[LABELSIZE];
    
    for (i = NUMTOKENS+2; i < tablesize();  i++)    {
        if ((symclass(i) == sttempvar || symclass(i) == stvariable)
            && getproc(i) == NUMTOKENS+1)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            if (data_class(i) == dtinteger)
                fprintf(ofp, "%-10s     dw     ?\n", label);
            else
                fprintf(ofp, "%-10s     dd     ?\n", label);
        }
        else if (symclass(i) == stliteral
                 && data_class(i) == dtreal)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            litvalue = getrvalue(i);
            fprintf(ofp, "%-10s     dd     %f\n",
                    label, litvalue);
        }
    }
    
    fprintf(ofp, "_DATA ENDS\n\n");
}